

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

bool CoreML::Specification::ReduceLayerParams_ReduceAxis_IsValid(int value)

{
  int value_local;
  
  return (uint)value < 5;
}

Assistant:

bool ReduceLayerParams_ReduceAxis_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
      return true;
    default:
      return false;
  }
}